

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ClauseCodeTree.cpp
# Opt level: O0

bool __thiscall
Indexing::ClauseCodeTree::removeOneOfAlternatives
          (ClauseCodeTree *this,CodeOp *op,Clause *cl,
          Stack<Indexing::CodeTree::CodeOp_*> *firstsInBlocks)

{
  bool bVar1;
  size_t sVar2;
  Clause *pCVar3;
  CodeOp **ppCVar4;
  undefined1 in_CL;
  undefined7 in_register_00000009;
  Clause *in_RDX;
  __off_t __length;
  CodeOp *in_RSI;
  uint initDepth;
  CodeOp *in_stack_00000060;
  Stack<Indexing::CodeTree::CodeOp_*> *in_stack_00000068;
  CodeTree *in_stack_00000070;
  CodeOp *in_stack_ffffffffffffffb8;
  undefined7 in_stack_ffffffffffffffc0;
  undefined1 in_stack_ffffffffffffffc7;
  CodeOp *local_18;
  
  sVar2 = Lib::Stack<Indexing::CodeTree::CodeOp_*>::size
                    ((Stack<Indexing::CodeTree::CodeOp_*> *)CONCAT71(in_register_00000009,in_CL));
  local_18 = in_RSI;
  while( true ) {
    bVar1 = CodeTree::CodeOp::isSuccess
                      ((CodeOp *)CONCAT17(in_stack_ffffffffffffffc7,in_stack_ffffffffffffffc0));
    in_stack_ffffffffffffffc7 = true;
    if (bVar1) {
      pCVar3 = CodeTree::CodeOp::getSuccessResult<Kernel::Clause>((CodeOp *)0x2f6283);
      in_stack_ffffffffffffffc7 = pCVar3 != in_RDX;
    }
    if ((bool)in_stack_ffffffffffffffc7 == false) break;
    ppCVar4 = CodeTree::CodeOp::alternative(local_18);
    local_18 = *ppCVar4;
    if (local_18 == (CodeOp *)0x0) {
      Lib::Stack<Indexing::CodeTree::CodeOp_*>::truncate
                ((Stack<Indexing::CodeTree::CodeOp_*> *)CONCAT71(in_register_00000009,in_CL),
                 (char *)(sVar2 & 0xffffffff),__length);
      return false;
    }
    Lib::Stack<Indexing::CodeTree::CodeOp_*>::push
              ((Stack<Indexing::CodeTree::CodeOp_*> *)
               CONCAT17(in_stack_ffffffffffffffc7,in_stack_ffffffffffffffc0),
               in_stack_ffffffffffffffb8);
  }
  CodeTree::CodeOp::makeFail(local_18);
  CodeTree::optimizeMemoryAfterRemoval(in_stack_00000070,in_stack_00000068,in_stack_00000060);
  return true;
}

Assistant:

bool ClauseCodeTree::removeOneOfAlternatives(CodeOp* op, Clause* cl, Stack<CodeOp*>* firstsInBlocks)
{
  unsigned initDepth=firstsInBlocks->size();

  while(!op->isSuccess() || op->getSuccessResult<Clause>()!=cl) {
    op=op->alternative();
    if(!op) {
      firstsInBlocks->truncate(initDepth);
      return false;
    }
    firstsInBlocks->push(op);
  }
  op->makeFail();
  optimizeMemoryAfterRemoval(firstsInBlocks, op);
  return true;
}